

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

uint16_t __thiscall websocketpp::uri::get_port_from_string(uri *this,string *port,error_code *ec)

{
  uint uVar1;
  ulong uVar2;
  char *__nptr;
  undefined8 *in_RDX;
  error_code *in_RDI;
  error_code eVar3;
  uint t_port;
  undefined4 uStack_54;
  undefined4 uStack_44;
  undefined8 local_30;
  undefined8 local_28;
  uint16_t local_2;
  
  std::error_code::error_code(in_RDI);
  *in_RDX = local_30;
  in_RDX[1] = local_28;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __nptr = (char *)std::__cxx11::string::c_str();
    uVar1 = atoi(__nptr);
    if (0xffff < uVar1) {
      eVar3 = error::make_error_code(0);
      *in_RDX = CONCAT44(uStack_44,eVar3._M_value);
      in_RDX[1] = eVar3._M_cat;
    }
    if (uVar1 == 0) {
      eVar3 = error::make_error_code(0);
      *in_RDX = CONCAT44(uStack_54,eVar3._M_value);
      in_RDX[1] = eVar3._M_cat;
    }
    local_2 = (uint16_t)uVar1;
  }
  else {
    local_2 = 0x50;
    if ((in_RDI[6]._M_value & 0x10000) != 0) {
      local_2 = 0x1bb;
    }
  }
  return local_2;
}

Assistant:

uint16_t get_port_from_string(std::string const & port, lib::error_code &
        ec) const
    {
        ec = lib::error_code();

        if (port.empty()) {
            return (m_secure ? uri_default_secure_port : uri_default_port);
        }

        unsigned int t_port = static_cast<unsigned int>(atoi(port.c_str()));

        if (t_port > 65535) {
            ec = error::make_error_code(error::invalid_port);
        }

        if (t_port == 0) {
            ec = error::make_error_code(error::invalid_port);
        }

        return static_cast<uint16_t>(t_port);
    }